

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_number.h
# Opt level: O0

void cppcms::impl::format_traits<unsigned_long,_true>::format(unsigned_long v,char *output,size_t n)

{
  undefined1 auVar1 [16];
  char cVar2;
  long in_RDX;
  char *in_RSI;
  ulong in_RDI;
  int digit;
  char *p;
  char *begin;
  char buf [29];
  char *local_48;
  char *local_40;
  char local_38 [32];
  long local_18;
  char *local_10;
  ulong local_8;
  
  local_40 = local_38;
  local_48 = local_40;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI == 0) {
    local_38[0] = '0';
    local_38[1] = 0;
  }
  else {
    while (local_8 != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_8;
      local_8 = local_8 / 10;
      cVar2 = SUB161(auVar1 % ZEXT816(10),0);
      if (SUB164(auVar1 % ZEXT816(10),0) < 0) {
        *local_48 = '0' - cVar2;
      }
      else {
        *local_48 = cVar2 + '0';
      }
      local_48 = local_48 + 1;
    }
    *local_48 = '\0';
    for (; local_48 = local_48 + -1, local_40 < local_48; local_40 = local_40 + 1) {
      std::swap<char>(local_40,local_48);
    }
  }
  strncpy(local_10,local_38,local_18 - 1);
  local_10[local_18 + -1] = '\0';
  return;
}

Assistant:

static void format(Value v,char *output,size_t n)
			{
				char buf[std::numeric_limits<Value>::digits10 + 10];
				char *begin = buf;
				if(v < 0) {
					*begin ++ = '-';
				}
				if(v == 0) {
					*begin ++ ='0';
					*begin = 0;
				}
				else {
					char *p=begin;
					while(v != 0) {
						int digit = v % 10;
						v/=10;
						if(digit < 0)
							*p++='0' - digit;
						else
							*p++='0' + digit;
					}
					*p-- = 0;
					while(begin < p) {
						std::swap(*begin,*p);
						begin++;
						p--;
					}
				}
				strncpy(output,buf,n-1);
				output[n-1] = 0;
			}